

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O3

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Merge
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  ScriptContextOptimizationOverrideInfo *pSVar1;
  INT_PTR IVar2;
  code *pcVar3;
  INT_PTR IVar4;
  INT_PTR IVar5;
  SideEffects SVar6;
  bool bVar7;
  undefined4 *puVar8;
  ScriptContextOptimizationOverrideInfo *pSVar9;
  ScriptContextOptimizationOverrideInfo *pSVar10;
  ScriptContextOptimizationOverrideInfo *pSVar11;
  ScriptContextOptimizationOverrideInfo *this_00;
  
  pSVar10 = this->crossSiteRoot;
  pSVar1 = info->crossSiteRoot;
  pSVar11 = info;
  if (pSVar10 == pSVar1) {
    if (pSVar10 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      return;
    }
    if (info->arraySetElementFastPathVtable == 1) {
      DisableArraySetElementFastPath(this);
    }
    this->sideEffects = this->sideEffects | info->sideEffects;
    this->crossSiteRoot = this;
    this->crossSitePrev = this;
    this->crossSiteNext = this;
    this_00 = this;
  }
  else {
    this_00 = pSVar10;
    if (pSVar10 == (ScriptContextOptimizationOverrideInfo *)0x0) {
      pSVar11 = this;
      this_00 = pSVar1;
    }
    if (pSVar11->arraySetElementFastPathVtable == 1) {
      DisableArraySetElementFastPath(this_00);
    }
    SVar6 = pSVar11->sideEffects | this_00->sideEffects;
    this_00->sideEffects = SVar6;
    if (this_00->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                  ,0x2b,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
      if (!bVar7) goto LAB_007a76ca;
      *puVar8 = 0;
      SVar6 = this_00->sideEffects;
    }
    IVar4 = this_00->arraySetElementFastPathVtable;
    IVar5 = this_00->intArraySetElementFastPathVtable;
    IVar2 = this_00->floatArraySetElementFastPathVtable;
    pSVar9 = this_00;
    do {
      pSVar9->arraySetElementFastPathVtable = IVar4;
      pSVar9->intArraySetElementFastPathVtable = IVar5;
      pSVar9->floatArraySetElementFastPathVtable = IVar2;
      pSVar9->sideEffects = SVar6;
      pSVar9 = pSVar9->crossSiteNext;
    } while (pSVar9 != this_00);
    if (pSVar10 != (ScriptContextOptimizationOverrideInfo *)0x0 &&
        pSVar1 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      pSVar10 = pSVar11;
      if (info->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x39,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
        if (!bVar7) {
LAB_007a76ca:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      do {
        pSVar1 = pSVar10->crossSiteNext;
        Insert(this_00,pSVar10);
        pSVar10 = pSVar1;
      } while (pSVar1 != pSVar11);
      goto LAB_007a76b3;
    }
  }
  Insert(this_00,pSVar11);
LAB_007a76b3:
  Verify(this);
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Merge(ScriptContextOptimizationOverrideInfo * info)
{
    ScriptContextOptimizationOverrideInfo * thisRoot = this->crossSiteRoot;
    ScriptContextOptimizationOverrideInfo * infoRoot = info->crossSiteRoot;
    if (thisRoot == infoRoot)
    {
        if (thisRoot != nullptr)
        {
            // Both info is already in the same info group
            return;
        }

        // Both of them are null, just group them

        // Update this to be the template
        this->Update(info);

        // Initialize the cross site list
        this->crossSiteRoot = this;
        this->crossSitePrev = this;
        this->crossSiteNext = this;

        // Insert the info to the list
        this->Insert(info);
    }
    else
    {
        if (thisRoot == nullptr)
        {
            thisRoot = infoRoot;
            infoRoot = nullptr;
            info = this;
        }

        thisRoot->Update(info);

        // Spread the information on the current group
        thisRoot->ForEachCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
        {
            thisRoot->CopyTo(i);
        });

        if (infoRoot == nullptr)
        {
            thisRoot->Insert(info);
        }
        else
        {
            // Insert the other group
            info->ForEachEditingCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
            {
                thisRoot->Insert(i);
            });
        }
    }

    DebugOnly(Verify());
}